

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

CompareMode glu::mapGLCompareFunc(deUint32 mode)

{
  InternalError *this;
  string local_60;
  ulong local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (mode - 0x200 < 8) {
    return *(CompareMode *)(&DAT_01cc1604 + (ulong)(mode - 0x200) * 4);
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_40 = (ulong)mode;
  tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_60,&local_40);
  std::operator+(&local_38,"Can\'t map GL compare mode ",&local_60);
  tcu::InternalError::InternalError(this,&local_38);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::Sampler::CompareMode mapGLCompareFunc (deUint32 mode)
{
	switch (mode)
	{
		case GL_LESS:		return tcu::Sampler::COMPAREMODE_LESS;
		case GL_LEQUAL:		return tcu::Sampler::COMPAREMODE_LESS_OR_EQUAL;
		case GL_GREATER:	return tcu::Sampler::COMPAREMODE_GREATER;
		case GL_GEQUAL:		return tcu::Sampler::COMPAREMODE_GREATER_OR_EQUAL;
		case GL_EQUAL:		return tcu::Sampler::COMPAREMODE_EQUAL;
		case GL_NOTEQUAL:	return tcu::Sampler::COMPAREMODE_NOT_EQUAL;
		case GL_ALWAYS:		return tcu::Sampler::COMPAREMODE_ALWAYS;
		case GL_NEVER:		return tcu::Sampler::COMPAREMODE_NEVER;
		default:
			throw tcu::InternalError("Can't map GL compare mode " + tcu::toHex(mode).toString());
	}
}